

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int solver2_lit_removable_rec(sat_solver2 *s,int v)

{
  byte bVar1;
  uint uVar2;
  clause *pcVar3;
  int iVar4;
  ulong uVar5;
  
  if ((*(byte *)(s->vi + v) >> 2 & 2) == 0) {
    pcVar3 = Sat_MemClauseHand(&s->Mem,s->reasons[v]);
    if (pcVar3 == (clause *)0x0) {
LAB_007164de:
      var_add_tag(s,v,2);
      uVar2 = 0;
    }
    else {
      for (uVar5 = 1; (uVar5 < (uint)*pcVar3 >> 0xb && (1 < (uint)pcVar3[uVar5 + 1]));
          uVar5 = uVar5 + 1) {
        iVar4 = (int)pcVar3[uVar5 + 1] >> 1;
        if ((*(byte *)(s->vi + iVar4) & 4) == 0) {
          bVar1 = *(byte *)(s->vi + iVar4) >> 2 & 0xf;
          if (((bVar1 != 6) && (s->levels[iVar4] != 0)) &&
             ((bVar1 == 2 ||
              ((-1 < (s->trail_lim).ptr[s->levels[iVar4]] ||
               (iVar4 = solver2_lit_removable_rec(s,iVar4), iVar4 == 0)))))) goto LAB_007164de;
        }
        else {
          solver2_lit_removable_rec(s,iVar4);
        }
      }
      if ((s->fProofLogging != 0) && (((uint)s->vi[v] & 4) != 0)) {
        veci_push(&s->min_lit_order,v);
      }
      var_add_tag(s,v,6);
      uVar2 = 1;
    }
  }
  else {
    uVar2 = *(byte *)(s->vi + v) >> 4 & 1;
  }
  return uVar2;
}

Assistant:

static int solver2_lit_removable_rec(sat_solver2* s, int v)
{
    // tag[0]: True if original conflict clause literal.
    // tag[1]: Processed by this procedure
    // tag[2]: 0=non-removable, 1=removable

    clause* c;
    int i, x;

    // skip visited
    if (var_tag(s,v) & 2)
        return (var_tag(s,v) & 4) > 0;

    // skip decisions on a wrong level
    c = clause2_read(s, var_reason(s,v));
    if ( c == NULL ){
        var_add_tag(s,v,2);
        return 0;
    }

    clause_foreach_var( c, x, i, 1 ){
        if (var_tag(s,x) & 1)
            solver2_lit_removable_rec(s, x);
        else{
            if (var_level(s,x) == 0 || var_tag(s,x) == 6) continue;     // -- 'x' checked before, found to be removable (or belongs to the toplevel)
            if (var_tag(s,x) == 2 || !var_lev_mark(s,x) || !solver2_lit_removable_rec(s, x))
            {  // -- 'x' checked before, found NOT to be removable, or it belongs to a wrong level, or cannot be removed
                var_add_tag(s,v,2);
                return 0;
            }
        }
    }
    if ( s->fProofLogging && (var_tag(s,v) & 1) )
        veci_push(&s->min_lit_order, v );
    var_add_tag(s,v,6);
    return 1;
}